

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O1

bool iDynTree::isFakeLink(Model *modelWithFakeLinks,LinkIndex linkToCheck)

{
  uint uVar1;
  int iVar2;
  Link *this;
  IJoint *pIVar3;
  double dVar4;
  Neighbor NVar5;
  
  this = Model::getLink(modelWithFakeLinks,linkToCheck);
  Link::getInertia(this);
  dVar4 = (double)iDynTree::SpatialInertia::getMass();
  if ((dVar4 <= 0.0) &&
     (uVar1 = Model::getNrOfNeighbors(modelWithFakeLinks,linkToCheck), uVar1 == 1)) {
    NVar5 = Model::getNeighbor(modelWithFakeLinks,linkToCheck,0);
    pIVar3 = Model::getJoint(modelWithFakeLinks,NVar5.neighborJoint);
    iVar2 = (*pIVar3->_vptr_IJoint[4])(pIVar3);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool isFakeLink(const Model& modelWithFakeLinks, const LinkIndex linkToCheck)
{
    // First condition: base link is massless
    double mass = modelWithFakeLinks.getLink(linkToCheck)->getInertia().getMass();
    if( mass > 0.0 )
    {
        return false;
    }

    // Second condition: the base link has only one child
    if( modelWithFakeLinks.getNrOfNeighbors(linkToCheck) != 1 )
    {
        return false;
    }

    // Third condition: the base link is attached to its child with a fixed joint
    Neighbor neigh = modelWithFakeLinks.getNeighbor(linkToCheck,0);
    if( modelWithFakeLinks.getJoint(neigh.neighborJoint)->getNrOfDOFs() > 0 )
    {
        return false;
    }

    return true;
}